

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakels_main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  launch_config config;
  allocator<char> local_1c1;
  _Head_base<0UL,_lscpp::transporter::iface_*,_false> local_1c0;
  int local_1b8;
  NamedVerbosity local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  string local_188;
  stdio_transporter local_168;
  undefined1 local_138 [16];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [8];
  TextDocumentService local_100;
  _Alloc_hider local_f8;
  _func_int *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>_>_>
  local_b8;
  _Optional_payload_base<cmakels::cmake_query::cmake_query> local_88;
  
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  local_1b8 = 0;
  local_1b0 = 0xfffffff7;
  local_1a0 = 0;
  local_198 = 0;
  local_108._0_4_ = 9;
  local_1a8 = &local_198;
  local_100._vptr_TextDocumentService = &local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"cmakels.log","");
  local_1b0 = local_108._0_4_;
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_100);
  if (local_100._vptr_TextDocumentService != &local_f0) {
    operator_delete(local_100._vptr_TextDocumentService,(ulong)(local_f0 + 1));
  }
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,argv[1],&local_1c1);
    cmakels::cmake_language_server::cmake_language_server
              ((cmake_language_server *)local_108,&local_188);
    local_138._0_4_ = local_1b8;
    local_138._8_4_ = local_1b0;
    local_128._M_p = (pointer)&local_118;
    std::__cxx11::string::_M_construct<char*>((string *)&local_128,local_1a8,local_1a8 + local_1a0);
    lscpp::stdio_transporter::stdio_transporter(&local_168,false);
    lscpp::transporter::transporter<lscpp::stdio_transporter>((transporter *)&local_1c0,&local_168);
    lscpp::launch((lsp_server *)local_108,(launch_config *)local_138,(transporter *)&local_1c0);
    if (local_1c0._M_head_impl != (iface *)0x0) {
      (*(local_1c0._M_head_impl)->_vptr_iface[1])();
    }
    local_1c0._M_head_impl = (iface *)0x0;
    if (local_168.data_._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0) {
      operator_delete__((void *)local_168.data_._M_t.
                                super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                super__Head_base<0UL,_char_*,_false>._M_head_impl);
    }
    local_168.data_._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
    if (local_168.comm_logger_.super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
        super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
        super__Optional_payload_base<lscpp::comm_logger>._M_engaged == true) {
      local_168.comm_logger_.super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_engaged = false;
      lscpp::comm_logger::~comm_logger((comm_logger *)&local_168);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_p != &local_118) {
      operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
    }
    local_108 = (undefined1  [8])&PTR_initialize_00678348;
    local_100._vptr_TextDocumentService = (_func_int **)&DAT_006783b0;
    if (local_88._M_engaged == true) {
      std::_Optional_payload_base<cmakels::cmake_query::cmake_query>::_M_destroy(&local_88);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmListFile>_>_>_>
    ::~_Rb_tree(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
    }
    return 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage ",6);
  poVar1 = std::operator<<((ostream *)&std::cerr,*argv);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," <build-dir>\n\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "<build-dir> - build directory relative to workspace root (usually defined by an IDE)",
             0x54);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  // Redirect std::cout to std::cerr to ensure that  cmake doesn't write to
  // stdout and messes up with lsp communication.
  // IMPORTANT: we must never use std::cout for lsp communication!
  std::cout.rdbuf(std::cerr.rdbuf());

  lscpp::launch_config config;
#ifndef NDEBUG
  config.startup_delay = 0;
#endif
  config.logger = {lscpp::Verbosity_MAX, "cmakels.log"};

  if (argc < 2) {
    std::cerr << "Usage " << argv[0] << " <build-dir>\n\n"
              << "<build-dir> - build directory relative to workspace root "
                 "(usually defined by an IDE)"
              << std::endl;
    std::exit(1);
  } else {
    lscpp::launch(cmakels::cmake_language_server{argv[1]}, config,
                  lscpp::stdio_transporter{false});
  }
}